

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

int yang_check_imports(lys_module *module,unres_schema *unres)

{
  byte size;
  byte size_00;
  lys_import *imp;
  lys_module *plVar1;
  lys_module *plVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  byte bVar7;
  int iVar8;
  lys_import *plVar9;
  lys_include *plVar10;
  char *pcVar11;
  LY_ERR *pLVar12;
  ulong uVar13;
  lys_import *plVar14;
  lys_import *inc;
  uint8_t start;
  ulong uVar15;
  ulong __nmemb;
  byte local_40;
  
  imp = module->imp;
  inc = (lys_import *)module->inc;
  size = module->imp_size;
  size_00 = module->inc_size;
  __nmemb = (ulong)size_00;
  if ((ulong)size == 0) {
LAB_00152a5b:
    if (__nmemb != 0) {
      plVar10 = (lys_include *)calloc(__nmemb,0x30);
      module->inc = plVar10;
      module->inc_size = '\0';
      if (plVar10 == (lys_include *)0x0) goto LAB_00152b8c;
    }
    if (size == 0) {
      local_40 = 0;
      bVar7 = local_40;
    }
    else {
      local_40 = 1;
      plVar9 = imp;
      do {
        plVar1 = plVar9->module;
        plVar9->module = (lys_module *)0x0;
        if (plVar9->prefix == (char *)0x0) {
          ly_vlog(LYE_MISSCHILDSTMT,LY_VLOG_NONE,(void *)0x0,"prefix","import");
LAB_00152cdf:
          free(plVar1);
          lydict_remove(module->ctx,plVar9->dsc);
          lydict_remove(module->ctx,plVar9->ref);
          lys_extension_instances_free(module->ctx,plVar9->ext,(uint)plVar9->ext_size);
          start = '\0';
          goto LAB_00152d55;
        }
        plVar14 = module->imp + module->imp_size;
        iVar8 = lyp_check_identifier(plVar9->prefix,LY_IDENT_PREFIX,module,(lys_node *)0x0);
        if (iVar8 != 0) goto LAB_00152cdf;
        plVar14->ref = plVar9->ref;
        plVar2 = plVar9->module;
        pcVar11 = plVar9->prefix;
        uVar3 = *(undefined8 *)plVar9->rev;
        uVar4 = *(undefined8 *)(plVar9->rev + 8);
        pcVar5 = plVar9->dsc;
        plVar14->ext = plVar9->ext;
        plVar14->dsc = pcVar5;
        *(undefined8 *)plVar14->rev = uVar3;
        *(undefined8 *)(plVar14->rev + 8) = uVar4;
        plVar14->module = plVar2;
        plVar14->prefix = pcVar11;
        pcVar11 = lydict_insert_zc(module->ctx,(char *)plVar1);
        iVar8 = lyp_check_import(module,pcVar11,plVar14);
        lydict_remove(module->ctx,pcVar11);
        module->imp_size = module->imp_size + '\x01';
        if (iVar8 != 0) {
          start = '\0';
          goto LAB_00152d55;
        }
        iVar8 = yang_check_ext_instance(module,&plVar14->ext,(uint)plVar14->ext_size,plVar14,unres);
        if (iVar8 != 0) {
          start = '\0';
          goto LAB_00152d55;
        }
        local_40 = local_40 + 1;
        plVar9 = plVar9 + 1;
        bVar7 = size;
      } while ((byte)(local_40 - size) != '\x01');
    }
    local_40 = bVar7;
    plVar9 = imp;
    if (__nmemb == 0) {
      iVar8 = 0;
    }
    else {
      uVar15 = 0;
      plVar14 = inc;
      do {
        plVar1 = plVar14->module;
        plVar14->module = (lys_module *)0x0;
        pcVar11 = lydict_insert_zc(module->ctx,(char *)plVar1);
        iVar8 = lyp_check_include(module,pcVar11,(lys_include *)plVar14,unres);
        if (iVar8 == 0) {
          plVar10 = module->inc;
          uVar13 = (ulong)((uint)module->inc_size * 0x30);
          plVar1 = plVar14->module;
          pcVar5 = plVar14->prefix;
          uVar3 = *(undefined8 *)plVar14->rev;
          uVar4 = *(undefined8 *)(plVar14->rev + 8);
          pcVar6 = plVar14->dsc;
          *(lys_ext_instance ***)(plVar10->rev + uVar13 + 0x18) = plVar14->ext;
          *(char **)(plVar10->rev + uVar13 + 0x18 + 8) = pcVar6;
          *(undefined8 *)(plVar10->rev + uVar13 + 8) = uVar3;
          *(undefined8 *)(plVar10->rev + uVar13 + 8 + 8) = uVar4;
          *(lys_module **)(plVar10->rev + (uVar13 - 8)) = plVar1;
          *(char **)(plVar10->rev + (uVar13 - 8) + 8) = pcVar5;
          plVar10 = module->inc;
          uVar13 = (ulong)((uint)module->inc_size * 0x30);
          iVar8 = yang_check_ext_instance
                            (module,(lys_ext_instance ***)(plVar10->rev + uVar13 + 0x10),
                             (uint)(byte)plVar10->rev[uVar13 + 0xb],plVar10->rev + (uVar13 - 8),
                             unres);
          module->inc_size = module->inc_size + '\x01';
          lydict_remove(module->ctx,pcVar11);
          if (iVar8 != 0) {
LAB_00152d4a:
            start = (char)uVar15 + '\x01';
            goto LAB_00152d55;
          }
        }
        else {
          if (iVar8 == -1) {
            lys_extension_instances_free
                      (module->ctx,*(lys_ext_instance ***)(plVar14->rev + 8),
                       (uint)(byte)plVar14->rev[3]);
            lydict_remove(module->ctx,pcVar11);
            goto LAB_00152d4a;
          }
          lydict_remove(module->ctx,pcVar11);
        }
        uVar15 = uVar15 + 1;
        plVar14 = (lys_import *)&plVar14->ref;
      } while (__nmemb != uVar15);
      iVar8 = 0;
    }
  }
  else {
    plVar9 = (lys_import *)calloc((ulong)size,0x38);
    module->imp = plVar9;
    module->imp_size = '\0';
    if (plVar9 != (lys_import *)0x0) goto LAB_00152a5b;
LAB_00152b8c:
    pLVar12 = ly_errno_location();
    *pLVar12 = LY_EMEM;
    start = '\0';
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_check_imports");
    local_40 = 0;
LAB_00152d55:
    yang_free_import(module->ctx,imp,local_40,size);
    yang_free_include(module->ctx,(lys_include *)inc,start,size_00);
    iVar8 = 1;
    plVar9 = inc;
    inc = imp;
  }
  free(inc);
  free(plVar9);
  return iVar8;
}

Assistant:

int
yang_check_imports(struct lys_module *module, struct unres_schema *unres)
{
    struct lys_import *imp;
    struct lys_include *inc;
    uint8_t imp_size, inc_size, j = 0, i = 0;
    char *s;

    imp = module->imp;
    imp_size = module->imp_size;
    inc = module->inc;
    inc_size = module->inc_size;

    if (imp_size) {
        module->imp = calloc(imp_size, sizeof *module->imp);
        module->imp_size = 0;
        if (!module->imp) {
            LOGMEM;
            goto error;
        }
    }

    if (inc_size) {
        module->inc = calloc(inc_size, sizeof *module->inc);
        module->inc_size = 0;
        if (!module->inc) {
            LOGMEM;
            goto error;
        }
    }

    for (i = 0; i < imp_size; ++i) {
        s = (char *) imp[i].module;
        imp[i].module = NULL;
        if (yang_fill_import(module, &imp[i], &module->imp[module->imp_size], s, unres)) {
            ++i;
            goto error;
        }
    }
    for (j = 0; j < inc_size; ++j) {
        s = (char *) inc[j].submodule;
        inc[j].submodule = NULL;
        if (yang_fill_include(module, s, &inc[j], unres)) {
            ++j;
            goto error;
        }
    }
    free(inc);
    free(imp);

    return EXIT_SUCCESS;

error:
    yang_free_import(module->ctx, imp, i, imp_size);
    yang_free_include(module->ctx, inc, j, inc_size);
    free(imp);
    free(inc);
    return EXIT_FAILURE;
}